

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerPagecount(Pager *pPager,Pgno *pnPage)

{
  int iVar1;
  long lStack_30;
  int rc;
  i64 n;
  Pgno *pPStack_20;
  Pgno nPage;
  Pgno *pnPage_local;
  Pager *pPager_local;
  
  pPStack_20 = pnPage;
  pnPage_local = (Pgno *)pPager;
  n._4_4_ = sqlite3WalDbsize(pPager->pWal);
  if ((n._4_4_ == 0) && (**(long **)(pnPage_local + 0x12) != 0)) {
    lStack_30 = 0;
    iVar1 = sqlite3OsFileSize(*(sqlite3_file **)(pnPage_local + 0x12),&stack0xffffffffffffffd0);
    if (iVar1 != 0) {
      return iVar1;
    }
    n._4_4_ = (Pgno)((lStack_30 + *(long *)(pnPage_local + 0x32) + -1) /
                    *(long *)(pnPage_local + 0x32));
  }
  if (pnPage_local[0x2f] < n._4_4_) {
    pnPage_local[0x2f] = n._4_4_;
  }
  *pPStack_20 = n._4_4_;
  return 0;
}

Assistant:

static int pagerPagecount(Pager *pPager, Pgno *pnPage){
  Pgno nPage;                     /* Value to return via *pnPage */

  /* Query the WAL sub-system for the database size. The WalDbsize()
  ** function returns zero if the WAL is not open (i.e. Pager.pWal==0), or
  ** if the database size is not available. The database size is not
  ** available from the WAL sub-system if the log file is empty or
  ** contains no valid committed transactions.
  */
  assert( pPager->eState==PAGER_OPEN );
  assert( pPager->eLock>=SHARED_LOCK );
  assert( isOpen(pPager->fd) );
  assert( pPager->tempFile==0 );
  nPage = sqlite3WalDbsize(pPager->pWal);

  /* If the number of pages in the database is not available from the
  ** WAL sub-system, determine the page count based on the size of
  ** the database file.  If the size of the database file is not an
  ** integer multiple of the page-size, round up the result.
  */
  if( nPage==0 && ALWAYS(isOpen(pPager->fd)) ){
    i64 n = 0;                    /* Size of db file in bytes */
    int rc = sqlite3OsFileSize(pPager->fd, &n);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nPage = (Pgno)((n+pPager->pageSize-1) / pPager->pageSize);
  }

  /* If the current number of pages in the file is greater than the
  ** configured maximum pager number, increase the allowed limit so
  ** that the file can be read.
  */
  if( nPage>pPager->mxPgno ){
    pPager->mxPgno = (Pgno)nPage;
  }

  *pnPage = nPage;
  return SQLITE_OK;
}